

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall wasm::LocalScanner::doWalkFunction(LocalScanner *this,Function *func)

{
  vector<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_> *this_00;
  bool bVar1;
  Index IVar2;
  size_t sVar3;
  reference pvVar4;
  Type type;
  value_type *info_1;
  Index i_1;
  value_type *info;
  Index i;
  Function *func_local;
  LocalScanner *this_local;
  
  this_00 = this->localInfo;
  sVar3 = Function::getNumLocals(func);
  std::vector<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>::resize(this_00,sVar3);
  info._4_4_ = 0;
  while( true ) {
    sVar3 = Function::getNumLocals(func);
    if (sVar3 <= info._4_4_) break;
    pvVar4 = std::vector<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>::operator[]
                       (this->localInfo,(ulong)info._4_4_);
    bVar1 = Function::isParam(func,info._4_4_);
    if (bVar1) {
      type = Function::getLocalType(func,info._4_4_);
      IVar2 = getBitsForType(type);
      pvVar4->maxBits = IVar2;
      pvVar4->signExtBits = 0xffffffff;
    }
    else {
      pvVar4->signExtBits = 0;
      pvVar4->maxBits = 0;
    }
    info._4_4_ = info._4_4_ + 1;
  }
  Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::doWalkFunction
            ((Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_> *)this,func);
  info_1._4_4_ = 0;
  while( true ) {
    sVar3 = Function::getNumLocals(func);
    if (sVar3 <= info_1._4_4_) break;
    pvVar4 = std::vector<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>::operator[]
                       (this->localInfo,(ulong)info_1._4_4_);
    if (pvVar4->signExtBits == 0xffffffff) {
      pvVar4->signExtBits = 0;
    }
    info_1._4_4_ = info_1._4_4_ + 1;
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    // prepare
    localInfo.resize(func->getNumLocals());
    for (Index i = 0; i < func->getNumLocals(); i++) {
      auto& info = localInfo[i];
      if (func->isParam(i)) {
        info.maxBits = getBitsForType(func->getLocalType(i)); // worst-case
        info.signExtBits = LocalInfo::kUnknown; // we will never know anything
      } else {
        info.maxBits = info.signExtBits = 0; // we are open to learning
      }
    }
    // walk
    PostWalker<LocalScanner>::doWalkFunction(func);
    // finalize
    for (Index i = 0; i < func->getNumLocals(); i++) {
      auto& info = localInfo[i];
      if (info.signExtBits == LocalInfo::kUnknown) {
        info.signExtBits = 0;
      }
    }
  }